

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  long *plVar1;
  long lVar2;
  unsigned_short *h;
  unsigned_short *h_00;
  value_type vVar3;
  ushort uVar4;
  unsigned_short *puVar5;
  size_t __n;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  unsigned_short uVar6;
  FP32 FVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  reference pvVar11;
  reference pvVar12;
  mz_ulong __n_00;
  reference pvVar13;
  reference pvVar14;
  value_type *pvVar15;
  ushort *__dest;
  reference pvVar16;
  long *plVar17;
  uint uVar18;
  ulong uVar19;
  value_type *pvVar20;
  unsigned_short uVar21;
  ushort uVar22;
  long lVar23;
  pointer pPVar24;
  long lVar25;
  uint uVar26;
  pointer plVar27;
  int y_2;
  ushort *__dest_00;
  short sVar28;
  uint uVar29;
  reference pvVar30;
  pointer puVar31;
  FP16 h_01;
  ushort uVar32;
  int iVar33;
  int *piVar34;
  value_type *pvVar35;
  value_type vVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  int *piVar40;
  value_type *pvVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  int iVar45;
  size_t i;
  ulong uVar46;
  pointer plVar47;
  int y;
  ulong uVar48;
  ushort *l;
  ushort *puVar49;
  uchar *b;
  pointer pPVar50;
  ushort *puVar51;
  bool bVar52;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000001c;
  ushort local_1f8;
  uint local_1ec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  int local_1c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  allocator_type local_189;
  ushort *local_188;
  vector<long_long,_std::allocator<long_long>_> scode;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<long_long,_std::allocator<long_long>_> freq;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bitmap;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lut;
  
  lVar42 = (long)param_4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buf,x_stride * lVar42 * CONCAT44(in_stack_00000014,line_no),(allocator_type *)&tmpBuf)
  ;
  uVar46 = 0;
  uVar43 = 0;
  if (0 < param_4) {
    uVar43 = (ulong)(uint)param_4;
  }
  uVar9 = 0;
  if (0 < x_stride) {
    uVar9 = (ulong)(uint)x_stride;
  }
  lVar10 = (long)width;
  lVar23 = param_6 * lVar10 * 4;
  lVar25 = lVar10 * 4;
  pvVar30 = (reference)(param_6 * lVar10 * 2);
  local_188 = (ushort *)(lVar10 * 2);
  for (; lVar10 = *(long *)CONCAT44(in_stack_0000001c,num_lines),
      uVar46 < (ulong)((((long *)CONCAT44(in_stack_0000001c,num_lines))[1] - lVar10) / 0x38);
      uVar46 = uVar46 + 1) {
    lVar2 = lVar10 + uVar46 * 0x38;
    iVar8 = *(int *)(lVar10 + 0x20 + uVar46 * 0x38);
    if (iVar8 == 2) {
      iVar8 = *(int *)(lVar2 + 0x24);
      if (iVar8 == 1) {
        lVar10 = lVar23;
        for (uVar48 = 0; uVar48 != uVar9; uVar48 = uVar48 + 1) {
          pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar48 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar46 * 8)) * lVar42);
          for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
            uVar26 = *(uint *)(images[uVar46] + uVar19 * 4 + lVar10);
            uVar18 = uVar26 >> 0x17;
            uVar29 = uVar18 & 0xff;
            uVar32 = (ushort)uVar29;
            if ((char)uVar18 != '\0') {
              if (uVar29 == 0xff) {
                uVar32 = ((uVar26 & 0x7fffff) != 0 | 0x3e) << 9;
              }
              else {
                uVar32 = 0x7c00;
                if (uVar29 < 0x8f) {
                  if (uVar29 < 0x71) {
                    uVar32 = 0;
                    if (uVar29 < 0x66) goto LAB_0010c066;
                    uVar37 = uVar26 & 0x7fffff | 0x800000;
                    uVar32 = (ushort)(uVar37 >> (0x7eU - (char)uVar18 & 0x1f));
                    uVar37 = uVar37 >> (0x7d - uVar29 & 0x1f);
                  }
                  else {
                    uVar32 = ((ushort)(uVar26 >> 0xd) & 0x3ff | (ushort)((uVar18 & 0x1f) << 10)) ^
                             0x4000;
                    uVar37 = uVar26 >> 0xc;
                  }
                  uVar32 = uVar32 + ((uVar37 & 1) != 0);
                }
LAB_0010c066:
                uVar32 = uVar32 & 0x7fff;
              }
            }
            pvVar11[uVar19 * 2] = (value_type)uVar32;
            pvVar11[uVar19 * 2 + 1] = (byte)(uVar26 >> 0x18) & 0x80 | (byte)(uVar32 >> 8);
          }
          lVar10 = lVar10 + lVar25;
        }
      }
      else {
        if (iVar8 != 2) {
LAB_0010c325:
          if (channels !=
              (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
            std::__cxx11::string::append((char *)channels);
          }
          goto LAB_0010cea2;
        }
        lVar10 = lVar23;
        for (uVar48 = 0; uVar48 != uVar9; uVar48 = uVar48 + 1) {
          pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar48 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar46 * 8)) * lVar42);
          for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
            *(undefined4 *)(pvVar11 + uVar19 * 4) =
                 *(undefined4 *)(images[uVar46] + uVar19 * 4 + lVar10);
          }
          lVar10 = lVar10 + lVar25;
        }
      }
    }
    else if (iVar8 == 1) {
      iVar8 = *(int *)(lVar2 + 0x24);
      if (iVar8 == 2) {
        pvVar11 = pvVar30;
        for (uVar48 = 0; uVar48 != uVar9; uVar48 = uVar48 + 1) {
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar48 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar46 * 8)) * lVar42);
          for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
            h_01._2_2_ = 0;
            h_01.u = *(ushort *)(images[uVar46] + (long)pvVar11 + uVar19 * 2);
            FVar7 = half_to_float(h_01);
            *(FP32 *)(pvVar12 + uVar19 * 4) = FVar7;
          }
          pvVar11 = pvVar11 + (long)local_188;
        }
      }
      else {
        if (iVar8 != 1) goto LAB_0010c325;
        pvVar11 = pvVar30;
        for (uVar48 = 0; uVar48 != uVar9; uVar48 = uVar48 + 1) {
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar48 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar46 * 8)) * lVar42);
          for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
            *(undefined2 *)(pvVar12 + uVar19 * 2) =
                 *(undefined2 *)(images[uVar46] + (long)pvVar11 + uVar19 * 2);
          }
          pvVar11 = pvVar11 + (long)local_188;
        }
      }
    }
    else if (iVar8 == 0) {
      lVar10 = lVar23;
      for (uVar48 = 0; uVar48 != uVar9; uVar48 = uVar48 + 1) {
        pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            (&buf,(uVar48 * CONCAT44(in_stack_00000014,line_no) +
                                  *(long *)(*(long *)pixel_data_size + uVar46 * 8)) * lVar42);
        for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
          *(undefined4 *)(pvVar11 + uVar19 * 4) =
               *(undefined4 *)(images[uVar46] + uVar19 * 4 + lVar10);
        }
        lVar10 = lVar10 + lVar25;
      }
    }
  }
  if (compression_type != 0) {
    if ((compression_type & 0xfffffffeU) == 2) {
      __n_00 = mz_compressBound(CONCAT44(buf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                         (int)buf.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish) -
                                CONCAT44(buf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)buf.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&block,__n_00,(allocator_type *)&tmpBuf);
      lVar42 = -(long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block,0);
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
      plVar47 = (pointer)(CONCAT44(buf.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)buf.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)buf.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&tmpBuf,(size_type)plVar47,(allocator_type *)&scode);
      pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      lVar23 = 0;
      for (pvVar30 = pvVar12; pvVar30 < pvVar12 + (long)plVar47; pvVar30 = pvVar30 + 2) {
        pvVar13[lVar23] = *pvVar30;
        if (pvVar12 + (long)plVar47 <= pvVar30 + 1) break;
        pvVar14[lVar23 + ((ulong)((long)plVar47 + 1U) >> 1)] = pvVar30[1];
        lVar23 = lVar23 + 1;
      }
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      vVar36 = *pvVar15;
      while (pvVar15 = pvVar15 + 1, pvVar15 < pvVar30 + (long)plVar47) {
        vVar3 = *pvVar15;
        *pvVar15 = (vVar3 - vVar36) + 0x80;
        vVar36 = vVar3;
      }
      scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)mz_compressBound((mz_ulong)plVar47);
      pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      iVar8 = mz_compress(pvVar11,(mz_ulong *)&scode,pvVar30,(mz_ulong)plVar47);
      plVar27 = (pointer)(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish + lVar42);
      if ((iVar8 == 0) &&
         (plVar27 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
         plVar47 <=
         scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_start)) {
        memcpy(pvVar11,pvVar12,(size_t)plVar47);
        plVar27 = plVar47;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (iVar8 == 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
                   (const_iterator)
                   (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + ((ulong)plVar27 & 0xffffffff)));
      }
      else if (channels !=
               (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
        std::__cxx11::string::append((char *)channels);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (iVar8 == 0) goto LAB_0010d203;
    }
    else if (compression_type == 0x80) {
      if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0)
      {
        std::__cxx11::string::append((char *)channels);
      }
    }
    else {
      if (compression_type == 4) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&block_2,(ulong)(((int)buf.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (int)buf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) * 2 + 0x2000),
                   (allocator_type *)&tmpBuf);
        __dest = (ushort *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block_2,0);
        pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        uVar43 = CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish) -
                 CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&bitmap,0x2000,(allocator_type *)&tmpBuf);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&tmpBuffer,uVar43 >> 1,(allocator_type *)&tmpBuf);
        std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
                  (&channelData,
                   (((long *)CONCAT44(in_stack_0000001c,num_lines))[1] -
                   *(long *)CONCAT44(in_stack_0000001c,num_lines)) / 0x38,(allocator_type *)&tmpBuf)
        ;
        pvVar16 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
        lVar42 = (long)channelData.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)channelData.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        piVar34 = (int *)(*(long *)CONCAT44(in_stack_0000001c,num_lines) + 0x24);
        piVar40 = &(channelData.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start)->size;
        while (bVar52 = lVar42 != 0, lVar42 = lVar42 + -1, bVar52) {
          ((PIZChannelData *)(piVar40 + -7))->start = pvVar16;
          *(reference *)(piVar40 + -5) = pvVar16;
          piVar40[-3] = param_4;
          piVar40[-2] = x_stride;
          iVar8 = *piVar34;
          *piVar40 = (iVar8 != 1) + 1;
          pvVar16 = pvVar16 + (x_stride * param_4 << (iVar8 != 1));
          piVar34 = piVar34 + 0xe;
          piVar40 = piVar40 + 8;
        }
        pPVar24 = channelData.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar11 = pvVar30;
        pPVar50 = channelData.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (iVar8 = 0; local_1c8 = (int)uVar9, iVar8 != local_1c8; iVar8 = iVar8 + 1) {
          lVar42 = 8;
          for (uVar46 = 0; uVar46 < (ulong)((long)pPVar24 - (long)pPVar50 >> 5); uVar46 = uVar46 + 1
              ) {
            lVar23 = (long)*(int *)((long)&pPVar50->ny + lVar42) *
                     (long)*(int *)((long)&pPVar50->end + lVar42);
            __n = lVar23 * 2;
            memcpy(*(void **)((long)&pPVar50->start + lVar42),pvVar11,__n);
            pvVar11 = pvVar11 + lVar23 * 2;
            plVar17 = (long *)((long)&pPVar50->start + lVar42);
            *plVar17 = *plVar17 + __n;
            lVar42 = lVar42 + 0x20;
            pPVar24 = channelData.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pPVar50 = channelData.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        pvVar16 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
        for (lVar42 = 0; lVar42 != 0x2000; lVar42 = lVar42 + 1) {
          bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar42] = '\0';
        }
        uVar9 = (ulong)((long)tmpBuffer.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)tmpBuffer.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 1;
        uVar48 = 0;
        uVar46 = uVar9 & 0xffffffff;
        if ((int)uVar9 < 1) {
          uVar46 = uVar48;
        }
        for (; uVar46 != uVar48; uVar48 = uVar48 + 1) {
          bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[pvVar16[uVar48] >> 3] =
               bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[pvVar16[uVar48] >> 3] |
               (byte)(1 << ((byte)pvVar16[uVar48] & 7));
        }
        *bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start =
             *bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start & 0xfe;
        uVar46 = 0x1fff;
        uVar18 = 0;
        uVar26 = 0;
        uVar9 = 0;
        while( true ) {
          uVar48 = uVar46 & 0xffff;
          if (uVar9 == 0x2000) break;
          if (bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] != '\0') {
            uVar46 = uVar48;
            if (uVar9 < uVar48) {
              uVar46 = uVar9 & 0xffffffff;
              uVar26 = uVar18;
            }
            if ((uVar26 & 0xffff) < uVar9) {
              uVar26 = (uint)uVar9;
              uVar18 = (uint)uVar9;
            }
          }
          uVar9 = uVar9 + 1;
        }
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&lut,0x10000,(allocator_type *)&tmpBuf);
        uVar9 = 0;
        uVar6 = 0;
        do {
          if (uVar9 == 0) {
LAB_0010c777:
            uVar21 = uVar6;
            uVar6 = uVar6 + 1;
          }
          else {
            if (uVar9 == 0x10000) goto LAB_0010c790;
            if ((bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9 >> 3 & 0x1fffffff] >> ((uint)uVar9 & 7) & 1)
                != 0) goto LAB_0010c777;
            uVar21 = 0;
          }
          lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = uVar21;
          uVar9 = uVar9 + 1;
        } while( true );
      }
      if (compression_type == 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&block,(ulong)((CONCAT44(buf.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                            (int)buf.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish) -
                                  CONCAT44(buf.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (int)buf.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)) * 3) >>
                          1,(allocator_type *)&tmpBuf);
        uVar43 = (long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block,0);
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        uVar46 = CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish) -
                 CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&tmpBuf,uVar46,(allocator_type *)&scode);
        pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        lVar42 = 0;
        for (pvVar30 = pvVar12; pvVar30 < pvVar12 + uVar46; pvVar30 = pvVar30 + 2) {
          pvVar13[lVar42] = *pvVar30;
          if (pvVar12 + uVar46 <= pvVar30 + 1) break;
          pvVar14[lVar42 + (uVar46 + 1 >> 1)] = pvVar30[1];
          lVar42 = lVar42 + 1;
        }
        pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        vVar36 = *pvVar15;
        while (pvVar15 = pvVar15 + 1, pvVar15 < pvVar30 + uVar46) {
          vVar3 = *pvVar15;
          *pvVar15 = (vVar3 - vVar36) + 0x80;
          vVar36 = vVar3;
        }
        pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        pvVar20 = pvVar30 + (int)uVar46;
        pvVar15 = pvVar30;
        pvVar13 = pvVar11;
        while (pvVar30 < pvVar20) {
          lVar42 = 0;
          pvVar41 = pvVar15;
          do {
            pvVar35 = pvVar41;
            pvVar41 = pvVar35 + 1;
            if (pvVar20 <= pvVar41) {
              lVar42 = 1 - lVar42;
              goto LAB_0010c634;
            }
            lVar23 = lVar42 + ~(ulong)pvVar15;
            lVar42 = lVar42 + -1;
          } while ((-0x80 < (long)(pvVar30 + lVar23)) && (*pvVar30 == *pvVar41));
          lVar42 = -lVar42;
LAB_0010c634:
          if ((long)(pvVar15 + (lVar42 - (long)pvVar30)) < 3) {
            vVar36 = (char)pvVar30 - (char)pvVar41;
            lVar42 = (long)pvVar41 - (long)pvVar30;
            for (pvVar35 = pvVar35 + 3; pvVar15 = pvVar35 + -2, pvVar15 < pvVar20;
                pvVar35 = pvVar35 + 1) {
              if (((pvVar35 + -1 < pvVar20) && (*pvVar15 == pvVar35[-1])) && (pvVar35 < pvVar20)) {
                if ((0x7e < lVar42) || (*pvVar15 == *pvVar35)) break;
              }
              else if (0x7e < lVar42) break;
              vVar36 = vVar36 + 0xff;
              lVar42 = lVar42 + 1;
            }
            *pvVar13 = vVar36;
            for (; pvVar13 = pvVar13 + 1, pvVar30 < pvVar15; pvVar30 = pvVar30 + 1) {
              *pvVar13 = *pvVar30;
            }
          }
          else {
            *pvVar13 = (char)(pvVar15 + (lVar42 - (long)pvVar30)) + 0xff;
            pvVar13[1] = *pvVar30;
            pvVar13 = pvVar13 + 2;
            pvVar30 = pvVar41;
            pvVar15 = pvVar41;
          }
        }
        uVar26 = (int)pvVar13 - (int)pvVar11;
        if ((0 < (int)uVar26) &&
           (uVar43 = (ulong)(uVar26 & 0x7fffffff), uVar46 <= (uVar26 & 0x7fffffff))) {
          memcpy(pvVar11,pvVar12,uVar46);
          uVar43 = uVar46;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        if ((int)uVar26 < 1) {
          if (channels !=
              (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
            std::__cxx11::string::append((char *)channels);
          }
        }
        else {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
                     (const_iterator)
                     (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + (uVar43 & 0xffffffff)));
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        if (0 < (int)uVar26) goto LAB_0010d203;
      }
    }
LAB_0010cea2:
    bVar52 = false;
    goto LAB_0010d205;
  }
  __first._M_current._4_4_ =
       buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  __first._M_current._0_4_ =
       (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  __last._M_current._4_4_ =
       buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  __last._M_current._0_4_ =
       (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
             (const_iterator)
             (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,__first,__last);
  goto LAB_0010d203;
LAB_0010c790:
  pvVar16 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  local_1f8 = uVar6 - 1;
  applyLut(lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start,pvVar16,
           (int)((ulong)((long)tmpBuffer.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)tmpBuffer.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1));
  *__dest = (ushort)uVar46;
  __dest[1] = (ushort)uVar18;
  __dest_00 = __dest + 2;
  if ((ushort)uVar46 <= (ushort)uVar18) {
    lVar42 = (uVar18 & 0xffff) - uVar48;
    memcpy(__dest_00,
           bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + uVar48,lVar42 + 1);
    __dest_00 = (ushort *)((long)__dest_00 + lVar42 + 1);
  }
  for (uVar46 = 0;
      uVar46 < (ulong)((long)channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar46 = uVar46 + 1) {
    pPVar24 = channelData.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar46;
    lVar42 = 0;
    for (lVar23 = 0; iVar8 = pPVar24->size, lVar23 < iVar8; lVar23 = lVar23 + 1) {
      puVar5 = pPVar24->start;
      uVar26 = pPVar24->nx;
      uVar18 = pPVar24->ny;
      iVar39 = uVar26 * iVar8;
      uVar29 = uVar18;
      if ((int)uVar26 < (int)uVar18) {
        uVar29 = uVar26;
      }
      local_1ec = 1;
      for (uVar37 = 2; (int)uVar37 <= (int)uVar29; uVar37 = uVar37 * 2) {
        iVar33 = (uVar26 - uVar37) * iVar8;
        lVar25 = (long)(int)(local_1ec * iVar8);
        lVar10 = (long)(int)(local_1ec * iVar39);
        puVar51 = (ushort *)(lVar25 * 2 + lVar10 * 2);
        local_188 = puVar51;
        for (puVar49 = (ushort *)((long)puVar5 + lVar42);
            puVar49 <= puVar5 + lVar23 + (int)((uVar18 - uVar37) * iVar39);
            puVar49 = puVar49 + (int)(uVar37 * iVar39)) {
          for (l = puVar49; l <= puVar49 + iVar33; l = l + (int)(uVar37 * iVar8)) {
            h = l + lVar10;
            h_00 = (unsigned_short *)((long)l + (long)puVar51);
            uVar32 = *l;
            uVar4 = l[lVar25];
            if (local_1f8 < 0x4000) {
              sVar28 = *h - *h_00;
              uVar38 = (int)(short)*h_00 + (int)(short)*h;
              *l = (unsigned_short)
                   ((uint)(((int)uVar38 >> 1) + ((int)(short)uVar4 + (int)(short)uVar32 >> 1)) >> 1)
              ;
              *h = (short)((uint)((int)(short)uVar4 + (int)(short)uVar32) >> 1) -
                   (short)(uVar38 >> 1);
              l[lVar25] = (unsigned_short)((uint)((int)sVar28 + (int)(short)(uVar32 - uVar4)) >> 1);
              *h_00 = (uVar32 - uVar4) - sVar28;
            }
            else {
              uVar38 = (uVar32 ^ 0x8000) - (uint)uVar4 & 0x8000ffff;
              iVar45 = (*h ^ 0x8000) - (uint)*h_00;
              wenc16((ushort)(uVar38 >> 0x10) ^ (ushort)((uVar32 ^ 0x8000) + (uint)uVar4 >> 1),
                     (ushort)((uint)iVar45 >> 0x10) & 0x8000 ^
                     (ushort)((uint)*h_00 + (*h ^ 0x8000) >> 1),l,h);
              wenc16((unsigned_short)uVar38,(unsigned_short)iVar45,l + lVar25,h_00);
              puVar51 = local_188;
            }
          }
          if ((uVar26 & local_1ec) != 0) {
            uVar32 = *l;
            uVar4 = l[lVar10];
            if (local_1f8 < 0x4000) {
              uVar22 = (ushort)((uint)((int)(short)uVar4 + (int)(short)uVar32) >> 1);
              iVar45 = (int)(short)uVar32 - (int)(short)uVar4;
            }
            else {
              iVar45 = (uVar32 ^ 0x8000) - (uint)uVar4;
              uVar22 = (ushort)((uint)iVar45 >> 0x10) & 0x8000 ^
                       (ushort)((uVar32 ^ 0x8000) + (uint)uVar4 >> 1);
            }
            l[lVar10] = (unsigned_short)iVar45;
            *l = uVar22;
          }
        }
        if ((uVar18 & local_1ec) != 0) {
          puVar51 = puVar49 + iVar33;
          for (; puVar49 <= puVar51; puVar49 = puVar49 + (int)(uVar37 * iVar8)) {
            uVar32 = *puVar49;
            uVar4 = puVar49[lVar25];
            if (local_1f8 < 0x4000) {
              uVar22 = (ushort)((uint)((int)(short)uVar4 + (int)(short)uVar32) >> 1);
              iVar33 = (int)(short)uVar32 - (int)(short)uVar4;
            }
            else {
              iVar33 = (uVar32 ^ 0x8000) - (uint)uVar4;
              uVar22 = (ushort)((uint)iVar33 >> 0x10) & 0x8000 ^
                       (ushort)((uVar32 ^ 0x8000) + (uint)uVar4 >> 1);
            }
            puVar49[lVar25] = (ushort)iVar33;
            *puVar49 = uVar22;
          }
        }
        local_1ec = uVar37;
      }
      lVar42 = lVar42 + 2;
    }
  }
  __dest_00[0] = 0;
  __dest_00[1] = 0;
  pvVar16 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  puVar51 = __dest_00 + 2;
  uVar46 = (ulong)((long)tmpBuffer.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)tmpBuffer.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 1;
  iVar8 = (int)uVar46;
  if (iVar8 == 0) {
    iVar8 = 0;
  }
  else {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&freq,0x10001,(allocator_type *)&tmpBuf);
    plVar47 = freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar42 = 0; lVar42 != 0x10001; lVar42 = lVar42 + 1) {
      freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar42] = 0;
    }
    uVar9 = 0;
    uVar48 = 0;
    if (0 < iVar8) {
      uVar48 = uVar46 & 0xffffffff;
    }
    for (; uVar48 != uVar9; uVar9 = uVar9 + 1) {
      freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
      ._M_start[pvVar16[uVar9]] =
           freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start[pvVar16[uVar9]] + 1;
    }
    local_188 = puVar51;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&tmpBuf,0x10001,(allocator_type *)&block);
    std::vector<long_long_*,_std::allocator<long_long_*>_>::vector
              ((vector<long_long_*,_std::allocator<long_long_*>_> *)&block,0x10001,
               (allocator_type *)&scode);
    plVar17 = plVar47 + -1;
    uVar46 = 0xffffffffffffffff;
    do {
      uVar46 = uVar46 + 1;
      plVar1 = plVar17 + 1;
      plVar17 = plVar17 + 1;
    } while (*plVar1 == 0);
    uVar48 = 0;
    iVar39 = 0;
    for (uVar9 = uVar46; lVar42 = (long)iVar39, uVar9 < 0x10001; uVar9 = uVar9 + 1) {
      *(int *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9 * 4) = (int)uVar9;
      if (*plVar17 != 0) {
        *(long **)(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar42 * 8) = plVar17;
        iVar39 = iVar39 + 1;
        uVar48 = uVar9 & 0xffffffff;
      }
      plVar17 = plVar17 + 1;
    }
    plVar47[(long)(int)uVar48 + 1] = 1;
    *(pointer *)
     (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + lVar42 * 8) = plVar47 + (long)(int)uVar48 + 1;
    std::make_heap<long_long**,tinyexr::FHeapCompare>
              (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar42 * 8 + 8);
    std::vector<long_long,_std::allocator<long_long>_>::vector(&scode,0x10001,&local_189);
    plVar27 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar42 = (long)(int)uVar48 + 1;
    memset(scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start,0,0x80008);
    uVar9 = (ulong)(iVar39 + 1);
    while (1 < (int)uVar9) {
      lVar23 = *(long *)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      std::pop_heap<long_long**,tinyexr::FHeapCompare>
                (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9 * 8);
      lVar25 = *(long *)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      std::pop_heap<long_long**,tinyexr::FHeapCompare>
                (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9 * 8 + -8);
      uVar19 = (ulong)(lVar23 - (long)plVar47) >> 3;
      uVar48 = (ulong)(lVar25 - (long)plVar47) >> 3;
      plVar47[(int)uVar48] = plVar47[(int)uVar48] + plVar47[(int)uVar19];
      uVar9 = uVar9 - 1;
      std::push_heap<long_long**,tinyexr::FHeapCompare>
                (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9 * 8);
      do {
        uVar26 = (uint)uVar48;
        lVar25 = (long)(int)uVar26;
        lVar23 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar25];
        scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = lVar23 + 1;
        if (0x39 < lVar23) goto LAB_0010ceca;
        uVar48 = (ulong)*(uint *)(tmpBuf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar25 * 4);
      } while (*(uint *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar25 * 4) != uVar26);
      *(int *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar25 * 4) = (int)uVar19;
      do {
        uVar26 = (uint)uVar19;
        lVar25 = (long)(int)uVar26;
        lVar23 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar25];
        scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = lVar23 + 1;
        if (0x39 < lVar23) goto LAB_0010ceca;
        uVar19 = (ulong)*(uint *)(tmpBuf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar25 * 4);
        plVar27 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (*(uint *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar25 * 4) != uVar26);
    }
    hufCanonicalCodeTable(plVar27);
    memcpy(plVar47,scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start,0x80008);
LAB_0010ceca:
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              (&scode.super__Vector_base<long_long,_std::allocator<long_long>_>);
    std::_Vector_base<long_long_*,_std::allocator<long_long_*>_>::~_Vector_base
              ((_Vector_base<long_long_*,_std::allocator<long_long_*>_> *)&block);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&tmpBuf);
    plVar47 = freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    uVar9 = uVar46 & 0xffffffff;
    tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(__dest_00 + 0xc);
    while( true ) {
      uVar26 = (uint)uVar9;
      if ((int)lVar42 < (int)uVar26) break;
      uVar48 = (ulong)(int)uVar26;
      uVar9 = plVar47[uVar48] & 0x3f;
      if (uVar9 == 0) {
        uVar19 = 0x3a;
        uVar44 = 0xfffffffb;
        while( true ) {
          uVar26 = (int)uVar44 + 6;
          if (((lVar42 <= (long)uVar48) || (0x104 < uVar26)) ||
             ((*(byte *)(plVar47 + uVar48 + 1) & 0x3f) != 0)) break;
          uVar48 = uVar48 + 1;
          uVar44 = (ulong)((int)uVar44 + 1);
          uVar19 = uVar19 + 1;
        }
        if (uVar26 < 2) {
          uVar26 = (uint)uVar48;
          goto LAB_0010cf70;
        }
        iVar39 = 6;
        if (5 < uVar26) {
          outputBits(6,0x3f,(longlong *)&block,(int *)&scode,(char **)&tmpBuf);
          iVar39 = 8;
          uVar19 = uVar44;
        }
        outputBits(iVar39,uVar19,(longlong *)&block,(int *)&scode,(char **)&tmpBuf);
      }
      else {
LAB_0010cf70:
        outputBits(6,uVar9,(longlong *)&block,(int *)&scode,(char **)&tmpBuf);
        uVar48 = (ulong)uVar26;
      }
      uVar9 = (ulong)((int)uVar48 + 1);
    }
    puVar31 = tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start) {
      puVar31 = tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      *tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start =
           (uchar)((long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start <<
                  (8U - (char)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0x3f));
    }
    block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    iVar39 = 0;
    lVar23 = 1;
    tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar31;
    while( true ) {
      uVar32 = pvVar16[lVar23 + -1];
      if (iVar8 <= lVar23) break;
      if (iVar39 < 0xff && uVar32 == pvVar16[lVar23]) {
        iVar39 = iVar39 + 1;
      }
      else {
        sendCode(freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32],iVar39,
                 freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar42],(longlong *)&block,(int *)&scode,
                 (char **)&tmpBuf);
        iVar39 = 0;
      }
      lVar23 = lVar23 + 1;
    }
    sendCode(freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar32],iVar39,
             freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar42],(longlong *)&block,(int *)&scode,
             (char **)&tmpBuf);
    puVar51 = local_188;
    if ((int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start == 0) {
      iVar8 = 0;
    }
    else {
      *tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start =
           (uchar)((long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start <<
                  (8U - (char)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0x3f));
      iVar8 = (int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    }
    iVar33 = (int)tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start - (int)puVar31;
    *(value_type *)(__dest_00 + 2) = (value_type)uVar46;
    *(value_type *)((long)__dest_00 + 5) = (value_type)(uVar46 >> 8);
    *(value_type *)(__dest_00 + 3) = (value_type)(uVar46 >> 0x10);
    *(value_type *)((long)__dest_00 + 7) = (value_type)(uVar46 >> 0x18);
    *(value_type *)(__dest_00 + 4) = (value_type)lVar42;
    *(value_type *)((long)__dest_00 + 9) = (value_type)((ulong)lVar42 >> 8);
    *(value_type *)(__dest_00 + 5) = (value_type)((ulong)lVar42 >> 0x10);
    *(value_type *)((long)__dest_00 + 0xb) = (value_type)((ulong)lVar42 >> 0x18);
    lVar42 = (long)puVar31 - (long)(__dest_00 + 0xc);
    *(value_type *)(__dest_00 + 6) = (value_type)lVar42;
    *(value_type *)((long)__dest_00 + 0xd) = (value_type)((ulong)lVar42 >> 8);
    *(value_type *)(__dest_00 + 7) = (value_type)((ulong)lVar42 >> 0x10);
    *(value_type *)((long)__dest_00 + 0xf) = (value_type)((ulong)lVar42 >> 0x18);
    iVar39 = iVar8 + iVar33 * 8;
    *(value_type *)(__dest_00 + 8) = (value_type)iVar39;
    *(value_type *)((long)__dest_00 + 0x11) = (value_type)((uint)iVar39 >> 8);
    *(value_type *)(__dest_00 + 9) = (value_type)((uint)iVar39 >> 0x10);
    *(value_type *)((long)__dest_00 + 0x13) = (value_type)((uint)iVar39 >> 0x18);
    iVar8 = ((iVar8 + iVar33 * 8 + 7) / 8 + (int)puVar31) - (int)local_188;
    __dest_00[10] = 0;
    __dest_00[0xb] = 0;
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              (&freq.super__Vector_base<long_long,_std::allocator<long_long>_>);
  }
  *(int *)__dest_00 = iVar8;
  uVar46 = (ulong)(uint)(((int)puVar51 - (int)__dest) + iVar8);
  if (uVar43 <= uVar46) {
    memcpy(__dest,pvVar30,uVar43);
    uVar46 = uVar43;
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
  ~_Vector_base(&channelData.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
               );
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
             (const_iterator)
             (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + uVar46));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_0010d203:
  bVar52 = true;
LAB_0010d205:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar52;
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if defined(TINYEXR_USE_MINIZ) && (TINYEXR_USE_MINIZ==1)
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#elif defined(TINYEXR_USE_NANOZLIB) && (TINYEXR_USE_NANOZLIB == 1)
    std::vector<unsigned char> block(nanoz_compressBound(
      static_cast<unsigned long>(buf.size())));
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "RLE compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    if (!CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines)) {
      if (err) {
        (*err) += "PIZ compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}